

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostModel.cpp
# Opt level: O0

void __thiscall tiger::trains::models::PostModel::PostModel(PostModel *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  std::vector<tiger::trains::models::EventModel,_std::allocator<tiger::trains::models::EventModel>_>
  ::vector((vector<tiger::trains::models::EventModel,_std::allocator<tiger::trains::models::EventModel>_>
            *)0x244d6c);
  return;
}

Assistant:

PostModel::PostModel()
{
}